

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  bool bVar1;
  pointer ppVar2;
  Value *other;
  mapped_type *this_00;
  iterator __position;
  iterator itLast;
  CZString keyLast;
  undefined1 local_a0 [8];
  CZString keey;
  ArrayIndex i;
  ArrayIndex oldSize;
  undefined4 local_5c;
  _Self local_58 [3];
  _Self local_40;
  iterator it;
  CZString key;
  Value *removed_local;
  ArrayIndex index_local;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) == 6) {
    CZString::CZString((CZString *)&it,index);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar1 = std::operator==(&local_40,local_58);
    if (bVar1) {
      this_local._7_1_ = false;
      local_5c = 1;
    }
    else {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator->(&local_40);
      Value((Value *)&i,&ppVar2->second);
      operator=(removed,(Value *)&i);
      ~Value((Value *)&i);
      keey._12_4_ = size(this);
      for (keey.field_1.index_ = index; keey.field_1.index_ < keey._12_4_ - 1;
          keey.field_1.index_ = keey.field_1.index_ + 1) {
        CZString::CZString((CZString *)local_a0,keey.field_1.index_);
        other = operator[](this,keey.field_1.index_ + 1);
        Value((Value *)&keyLast.field_1.storage_,other);
        this_00 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::operator[]((this->value_).map_,(key_type *)local_a0);
        operator=(this_00,(Value *)&keyLast.field_1.storage_);
        ~Value((Value *)&keyLast.field_1.storage_);
        CZString::~CZString((CZString *)local_a0);
      }
      CZString::CZString((CZString *)&itLast,keey._12_4_ - 1);
      __position = std::
                   map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   ::find((this->value_).map_,(key_type *)&itLast);
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                          *)(this->value_).map_,__position);
      this_local._7_1_ = true;
      local_5c = 1;
      CZString::~CZString((CZString *)&itLast);
    }
    CZString::~CZString((CZString *)&it);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type_ != arrayValue) {
    return false;
  }
  CZString key(index);
  ObjectValues::iterator it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i){
    CZString keey(i);
    (*value_.map_)[keey] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  ObjectValues::iterator itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}